

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_ffi_typeof(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  jit_State *in_RDI;
  TRef unaff_retaddr;
  jit_State *in_stack_00000008;
  TRef trid;
  TraceError in_stack_ffffffffffffff5c;
  jit_State *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  int32_t k;
  jit_State *J_00;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  cTValue *in_stack_fffffffffffffff8;
  
  k = (int32_t)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if ((*in_RDI->base & 0x1f000000) == 0xa000000) {
    argv2ctype(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
    TVar1 = lj_ir_kint((jit_State *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),k)
    ;
    J_00 = in_RDI;
    TVar2 = lj_ir_kint((jit_State *)CONCAT44(TVar1,in_stack_ffffffffffffff70),
                       (int32_t)((ulong)in_RDI >> 0x20));
    (J_00->fold).ins.field_0.ot = 0x528a;
    (J_00->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J_00->fold).ins.field_0.op2 = (IRRef1)TVar1;
    TVar1 = lj_opt_fold(J_00);
    *in_RDI->base = TVar1;
    return;
  }
  (in_RDI->errinfo).u32.lo = (uint32_t)in_RDI->fn;
  (in_RDI->errinfo).field_2.it = 0xfffffff7;
  lj_trace_err_info(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
}

Assistant:

void LJ_FASTCALL recff_ffi_typeof(jit_State *J, RecordFFData *rd)
{
  if (tref_iscdata(J->base[0])) {
    TRef trid = lj_ir_kint(J, argv2ctype(J, J->base[0], &rd->argv[0]));
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA),
			lj_ir_kint(J, CTID_CTYPEID), trid);
  } else {
    setfuncV(J->L, &J->errinfo, J->fn);
    lj_trace_err_info(J, LJ_TRERR_NYIFFU);
  }
}